

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

void __thiscall
CorUnix::CSynchData::Signal
          (CSynchData *this,CPalThread *pthrCurrent,LONG lSignalCount,bool fWorkerThread)

{
  FILE *__stream;
  ThreadReleaseSemantics TVar1;
  OwnershipSemantics OVar2;
  LONG LVar3;
  uint uVar4;
  uint uVar5;
  CObjectType *pCVar6;
  bool local_1f;
  undefined1 local_1e;
  byte local_1d;
  LONG local_1c;
  bool fReleaseAltersSignalCount;
  bool fDelegatedSignaling;
  bool fThreadReleased;
  bool fWorkerThread_local;
  LONG lSignalCount_local;
  CPalThread *pthrCurrent_local;
  CSynchData *this_local;
  
  local_1e = 0;
  local_1f = false;
  local_1d = fWorkerThread;
  local_1c = lSignalCount;
  _fReleaseAltersSignalCount = pthrCurrent;
  pthrCurrent_local = (CPalThread *)this;
  pCVar6 = GetObjectType(this);
  TVar1 = CObjectType::GetThreadReleaseSemantics(pCVar6);
  if (local_1c < 0) {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x3f1);
    fprintf(_stderr,"Expression: 0 <= lSignalCount\n");
  }
  this->m_lSignalCount = local_1c;
  while ((0 < this->m_lSignalCount &&
         (local_1e = ReleaseFirstWaiter(this,_fReleaseAltersSignalCount,&local_1f,
                                        (bool)(local_1d & 1)), (bool)local_1e))) {
    if (TVar1 == ThreadReleaseAltersSignalCount) {
      this->m_lSignalCount = this->m_lSignalCount + -1;
    }
    if ((local_1f & 1U) != 0) {
      this->m_lSignalCount = 0;
    }
  }
  pCVar6 = GetObjectType(this);
  OVar2 = CObjectType::GetOwnershipSemantics(pCVar6);
  if ((OVar2 == OwnershipTracked) &&
     ((LVar3 = GetOwnershipCount(this), LVar3 != 0 && (LVar3 = GetSignalCount(this), LVar3 != 0))))
  {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x413);
    __stream = _stderr;
    uVar4 = GetOwnershipCount(this);
    uVar5 = GetSignalCount(this);
    fprintf(__stream,
            "Expression: CObjectType::OwnershipTracked != GetObjectType()->GetOwnershipSemantics() || 0 == GetOwnershipCount() || 0 == GetSignalCount(), Description: Conflicting values for SignalCount [%d] and OwnershipCount [%d]\n"
            ,(ulong)uVar4,(ulong)uVar5);
  }
  if ((this->m_otiObjectTypeId == otiMutex) && (1 < this->m_lSignalCount)) {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x416);
    fprintf(_stderr,
            "Expression: otiMutex != m_otiObjectTypeId || m_lSignalCount <= 1, Description: Mutex with invalid singal count\n"
           );
  }
  return;
}

Assistant:

void CSynchData::Signal(
        CPalThread * pthrCurrent, 
        LONG lSignalCount, 
        bool fWorkerThread)
    {
        VALIDATEOBJECT(this);

        bool fThreadReleased = false;
        bool fDelegatedSignaling = false;
        bool fReleaseAltersSignalCount = 
            (CObjectType::ThreadReleaseAltersSignalCount ==
                GetObjectType()->GetThreadReleaseSemantics());

        _ASSERTE(0 <= lSignalCount);

        // Preset the signal count to the new value, so that it can be used
        // by ReleaseFirstWaiter when delegating signaling to another process
        m_lSignalCount = lSignalCount;
        
        while (m_lSignalCount > 0)
        {
            fThreadReleased = ReleaseFirstWaiter(pthrCurrent, 
                                                 &fDelegatedSignaling, 
                                                 fWorkerThread);
            if (!fThreadReleased)
            {
                // No more threads to release: break out of the loop
                // keeping the current signal count
                break;
            }
            if (fReleaseAltersSignalCount)
            {
                // Adjust signal count
                m_lSignalCount--;
            }
            if (fDelegatedSignaling)
            {
                // Object signaling has been delegated
                m_lSignalCount = 0;
            }                    
        }
        
        _ASSERT_MSG(CObjectType::OwnershipTracked != 
                    GetObjectType()->GetOwnershipSemantics() || 
                    0 == GetOwnershipCount() || 0 == GetSignalCount(),
                    "Conflicting values for SignalCount [%d] and "
                    "OwnershipCount [%d]\n", 
                    GetOwnershipCount(), GetSignalCount());

        _ASSERT_MSG(otiMutex != m_otiObjectTypeId || m_lSignalCount <= 1,
                    "Mutex with invalid singal count\n");

        return;
    }